

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::match(CharScanner *this,char *s)

{
  uint uVar1;
  undefined8 uVar2;
  byte *in_RSI;
  long *in_RDI;
  CharScanner *in_stack_00000018;
  int c;
  int la_1;
  byte *local_10;
  
  local_10 = in_RSI;
  while( true ) {
    if (*local_10 == 0) {
      return;
    }
    uVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,1);
    if (uVar1 != *local_10) break;
    (**(code **)(*in_RDI + 0x40))();
    local_10 = local_10 + 1;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  MismatchedCharException::MismatchedCharException
            ((MismatchedCharException *)this,s._4_4_,(int)s,la_1._3_1_,in_stack_00000018);
  __cxa_throw(uVar2,&MismatchedCharException::typeinfo,
              MismatchedCharException::~MismatchedCharException);
}

Assistant:

virtual void match( const char* s )
	{
		while( *s != '\0' )
		{
			// the & 0xFF is here to prevent sign extension lateron
			int la_1 = LA(1), c = (*s++ & 0xFF);

			if ( la_1 != c )
				throw MismatchedCharException(la_1, c, false, this);

			consume();
		}
	}